

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

void __thiscall capnp::LocalClient::~LocalClient(LocalClient *this)

{
  ClientHook *pCVar1;
  Disposer *pDVar2;
  ForkHub<kj::_::Void> *pFVar3;
  Server *pSVar4;
  
  if ((this->server).ptr.ptr != (Server *)0x0) {
    (((this->server).ptr.ptr)->thisHook).ptr = (ClientHook *)0x0;
  }
  if ((this->brokenException).ptr.isSet == true) {
    kj::Exception::~Exception(&(this->brokenException).ptr.field_1.value);
  }
  if ((this->revoker).ptr.isSet == true) {
    kj::Canceler::~Canceler(&(this->revoker).ptr.field_1.value);
  }
  pCVar1 = (this->resolved).ptr.ptr;
  if (pCVar1 != (ClientHook *)0x0) {
    (this->resolved).ptr.ptr = (ClientHook *)0x0;
    pDVar2 = (this->resolved).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
  }
  if (((this->resolveTask).ptr.isSet == true) &&
     (pFVar3 = (this->resolveTask).ptr.field_1.value.hub.ptr, pFVar3 != (ForkHub<kj::_::Void> *)0x0)
     ) {
    (this->resolveTask).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar2 = (this->resolveTask).ptr.field_1.value.hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar3->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar3->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pSVar4 = (this->server).ptr.ptr;
  if (pSVar4 != (Server *)0x0) {
    (this->server).ptr.ptr = (Server *)0x0;
    pDVar2 = (this->server).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)((long)&pSVar4->_vptr_Server + (long)pSVar4->_vptr_Server[-2]));
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~LocalClient() noexcept(false) {
    KJ_IF_SOME(s, server) {
      s->thisHook = kj::none;
    }
  }